

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuperCardPro.cpp
# Opt level: O1

bool __thiscall SuperCardPro::ReadExact(SuperCardPro *this,void *buf,int len)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  int bytes_read;
  int local_2c;
  
  local_2c = 0;
  bVar3 = len < 1;
  if ((0 < len) && (iVar1 = (*this->_vptr_SuperCardPro[2])(), (char)iVar1 != '\0')) {
    do {
      bVar3 = len - local_2c < 1;
      uVar2 = len - local_2c;
      if (uVar2 == 0 || len < local_2c) {
        return bVar3;
      }
      buf = (void *)((long)buf + (long)local_2c);
      iVar1 = (*this->_vptr_SuperCardPro[2])(this,buf,(ulong)uVar2,&local_2c);
      len = uVar2;
    } while ((char)iVar1 != '\0');
  }
  return bVar3;
}

Assistant:

bool SuperCardPro::ReadExact(void* buf, int len)
{
    uint8_t* p = reinterpret_cast<uint8_t*>(buf);
    auto bytes_read = 0;

    while (len > 0)
    {
        if (!Read(p, len, &bytes_read))
            return false;

        p += bytes_read;
        len -= bytes_read;
    }
    return true;
}